

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

EnumDecl * __thiscall SQASTReader::readEnumDecl(SQASTReader *this)

{
  InputStream *pIVar1;
  SQChar *pSVar2;
  Arena *this_00;
  EnumDecl *this_01;
  int iVar3;
  Chunk *pCVar4;
  LiteralExpr *val;
  byte bVar5;
  ulong uVar6;
  uint64_t v_2;
  ulong uVar7;
  uint64_t v;
  ulong uVar8;
  
  pIVar1 = this->stream;
  uVar8 = 0;
  bVar5 = 0;
  do {
    iVar3 = (**pIVar1->_vptr_InputStream)(pIVar1);
    uVar8 = uVar8 | (ulong)((byte)iVar3 & 0x7f) << (bVar5 & 0x3f);
    bVar5 = bVar5 + 7;
  } while ((char)(byte)iVar3 < '\0');
  pSVar2 = (this->stringVector)._vals[uVar8 & 0xffffffff];
  iVar3 = (**this->stream->_vptr_InputStream)();
  this_00 = this->astArena;
  pCVar4 = Arena::findChunk(this_00,0x48);
  this_01 = (EnumDecl *)pCVar4->_ptr;
  pCVar4->_ptr = (uint8_t *)(this_01 + 1);
  (this_01->super_Decl).super_Statement.super_Node._op = TO_ENUM;
  (this_01->super_Decl).super_Statement.super_Node._coordinates.lineStart = -1;
  (this_01->super_Decl).super_Statement.super_Node._coordinates.columnStart = -1;
  (this_01->super_Decl).super_Statement.super_Node._coordinates.lineEnd = -1;
  (this_01->super_Decl).super_Statement.super_Node._coordinates.columnEnd = -1;
  (this_01->super_Decl).super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a4dc8;
  (this_01->_consts)._arena = this_00;
  (this_01->_consts)._vals = (EnumConst *)0x0;
  (this_01->_consts)._size = 0;
  (this_01->_consts)._allocated = 0;
  this_01->_id = pSVar2;
  this_01->_global = (char)iVar3 != '\0';
  pIVar1 = this->stream;
  uVar8 = 0;
  bVar5 = 0;
  do {
    iVar3 = (**pIVar1->_vptr_InputStream)(pIVar1);
    uVar8 = uVar8 | (ulong)((byte)iVar3 & 0x7f) << (bVar5 & 0x3f);
    bVar5 = bVar5 + 7;
  } while ((char)(byte)iVar3 < '\0');
  ArenaVector<SQCompilation::EnumConst>::resize(&this_01->_consts,(size_type_conflict)uVar8);
  if (uVar8 != 0) {
    uVar6 = 0;
    do {
      pIVar1 = this->stream;
      uVar7 = 0;
      bVar5 = 0;
      do {
        iVar3 = (**pIVar1->_vptr_InputStream)(pIVar1);
        uVar7 = uVar7 | (ulong)((byte)iVar3 & 0x7f) << (bVar5 & 0x3f);
        bVar5 = bVar5 + 7;
      } while ((char)(byte)iVar3 < '\0');
      pSVar2 = (this->stringVector)._vals[uVar7 & 0xffffffff];
      val = readNonNullLiteral(this);
      SQCompilation::EnumDecl::addConst(this_01,pSVar2,val);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar8);
  }
  return this_01;
}

Assistant:

EnumDecl *SQASTReader::readEnumDecl() {
  const SQChar *name = readString();
  bool isGlobal = stream->readInt8();

  EnumDecl *e = newNode<EnumDecl>(astArena, name, isGlobal);

  size_t size = stream->readUInt64();
  e->consts().resize(size);

  for (size_t i = 0; i < size; ++i) {
    const SQChar *n = readString();
    LiteralExpr *v = readNonNullLiteral();
    e->addConst(n, v);
  }

  return e;
}